

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O3

int pcp_pulse(pcp_ctx_t *ctx,timeval *next_timeout)

{
  pcp_recv_msg_t *f;
  sockaddr_storage *src_addr;
  in6_addr *dst_ip6;
  uint32_t *dst_scope_id;
  undefined1 auVar1 [16];
  undefined8 uVar2;
  int iVar3;
  pcp_errno pVar4;
  ssize_t sVar5;
  time_t tVar6;
  pcp_server_t *s;
  timeval *ptVar7;
  in6_addr *__a;
  timeval *ptVar8;
  uint32_t scope_id;
  timeval tmp_timeout;
  socklen_t src_len;
  uint32_t local_64;
  sockaddr *local_60;
  timeval local_58;
  anon_union_16_3_a3f0114d_for___in6_u local_40;
  
  local_58.tv_sec = 0;
  local_58.tv_usec = 0;
  if (ctx == (pcp_ctx_t *)0x0) {
    return -8;
  }
  f = &ctx->msg;
  ptVar8 = next_timeout;
  if (next_timeout == (timeval *)0x0) {
    ptVar8 = &local_58;
  }
  local_40.__u6_addr32[0] = 0x80;
  memset(f,0,0x578);
  src_addr = &(ctx->msg).rcvd_from_addr;
  local_60 = (sockaddr *)&(ctx->msg).rcvd_to_addr;
  sVar5 = pcp_socket_recvfrom(ctx,(ctx->msg).pcp_msg_buffer,0x44c,0x40,(sockaddr *)src_addr,
                              (socklen_t *)local_40.__u6_addr8,(sockaddr_in6 *)local_60);
  if (sVar5 < 0) {
    if ((uint32_t)sVar5 != 0) goto LAB_00104f0a;
  }
  else {
    (ctx->msg).pcp_msg_len = (uint32_t)sVar5;
  }
  tVar6 = time((time_t *)0x0);
  (ctx->msg).received_time = tVar6;
  iVar3 = validate_pcp_msg(f);
  if ((iVar3 != 0) && (pVar4 = parse_response(f), pVar4 == PCP_ERR_SUCCESS)) {
    pcp_fill_in6_addr((in6_addr *)&local_40,(uint16_t *)0x0,&local_64,(sockaddr *)src_addr);
    s = get_pcp_server_by_ip(ctx,(in6_addr *)&local_40,local_64);
    if (s != (pcp_server_t *)0x0) {
      (ctx->msg).pcp_server_indx = s->index;
      uVar2 = *(undefined8 *)(s->pcp_ip + 2);
      *(undefined8 *)&(ctx->msg).kd.pcp_server_ip.__in6_u = *(undefined8 *)s->pcp_ip;
      *(undefined8 *)((long)&(ctx->msg).kd.pcp_server_ip.__in6_u + 8) = uVar2;
      dst_ip6 = &(ctx->msg).kd.src_ip;
      dst_scope_id = &(ctx->msg).kd.scope_id;
      pcp_fill_in6_addr(dst_ip6,(uint16_t *)0x0,dst_scope_id,local_60);
      if ((((ctx->msg).kd.src_ip.__in6_u.__u6_addr32[0] == 0) &&
          ((ctx->msg).kd.src_ip.__in6_u.__u6_addr32[1] == 0)) &&
         ((((ctx->msg).kd.src_ip.__in6_u.__u6_addr32[2] == 0 &&
           ((ctx->msg).kd.src_ip.__in6_u.__u6_addr32[3] == 0)) ||
          (((((ctx->msg).kd.src_ip.__in6_u.__u6_addr32[2] == 0xffff0000 &&
             ((ctx->msg).kd.src_ip.__in6_u.__u6_addr8[0xc] == '\0')) &&
            ((ctx->msg).kd.src_ip.__in6_u.__u6_addr8[0xd] == '\0')) &&
           (((ctx->msg).kd.src_ip.__in6_u.__u6_addr8[0xe] == '\0' &&
            ((ctx->msg).kd.src_ip.__in6_u.__u6_addr8[0xf] == '\0')))))))) {
        uVar2 = *(undefined8 *)(s->src_ip + 2);
        *(undefined8 *)&dst_ip6->__in6_u = *(undefined8 *)s->src_ip;
        *(undefined8 *)((long)&(ctx->msg).kd.src_ip.__in6_u + 8) = uVar2;
        *dst_scope_id = local_64;
      }
      if ((ctx->msg).recv_version < 2) {
        (ctx->msg).kd.nonce.n[2] = (s->nonce).n[2];
        *(undefined8 *)(ctx->msg).kd.nonce.n = *(undefined8 *)(s->nonce).n;
      }
      hserver_iter(s,&DAT_001086e0);
    }
  }
LAB_00104f0a:
  local_40.__u6_addr32[2] = 1;
  local_40._0_8_ = ptVar8;
  pcp_db_foreach_server(ctx,hserver_iter,&local_40);
  ptVar7 = &local_58;
  if (next_timeout != (timeval *)0x0) {
    ptVar7 = next_timeout;
  }
  auVar1 = SEXT816(0x20c49ba5e353f7cf) * SEXT816(ptVar7->tv_usec);
  return ((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)) + (int)ptVar8->tv_sec * 1000;
}

Assistant:

int pcp_pulse(pcp_ctx_t *ctx, struct timeval *next_timeout) {
    pcp_recv_msg_t *msg;
    struct timeval tmp_timeout = {0, 0};

    if (!ctx) {
        return PCP_ERR_BAD_ARGS;
    }

    msg = &ctx->msg;

    if (!next_timeout) {
        next_timeout = &tmp_timeout;
    }

    memset(msg, 1, sizeof(*msg));

    if (read_msg(ctx, msg) == PCP_ERR_SUCCESS) {
        struct in6_addr ip6;
        uint32_t scope_id;
        pcp_server_t *s;
        struct hserver_iter_data param = {NULL, pcpe_io_event};

        msg->received_time = time(NULL);

        if (!validate_pcp_msg(msg)) {
            PCP_LOG(PCP_LOGLVL_PERR, "%s", "Invalid PCP msg");
            goto process_timeouts;
        }

        if ((parse_response(msg)) != PCP_ERR_SUCCESS) {
            PCP_LOG(PCP_LOGLVL_PERR, "%s", "Cannot parse PCP msg");
            goto process_timeouts;
        }

        pcp_fill_in6_addr(&ip6, NULL, &scope_id,
                          (struct sockaddr *)&msg->rcvd_from_addr);
        PCP_LOG(PCP_LOGLVL_DEBUG, "SCOPE_ID: %u", scope_id);
        s = get_pcp_server_by_ip(ctx, &ip6, scope_id);

        if (s) {
            PCP_LOG(PCP_LOGLVL_DEBUG, "Found server: %s", s->pcp_server_paddr);
            msg->pcp_server_indx = s->index;
            memcpy(&msg->kd.pcp_server_ip, s->pcp_ip, sizeof(struct in6_addr));
            pcp_fill_in6_addr(&msg->kd.src_ip, NULL, &msg->kd.scope_id,
                              (struct sockaddr *)&msg->rcvd_to_addr);
            if (IPV6_IS_ADDR_ANY(&msg->kd.src_ip)) {
                memcpy(&msg->kd.src_ip, s->src_ip, sizeof(struct in6_addr));
                msg->kd.scope_id = scope_id;
            }
            if (msg->recv_version < 2) {
                memcpy(&msg->kd.nonce, &s->nonce, sizeof(struct pcp_nonce));
            }

            // process pcpe_io_event for server
            hserver_iter(s, &param);
        }
    }

process_timeouts : {
    struct hserver_iter_data param = {next_timeout, pcpe_timeout};
    pcp_db_foreach_server(ctx, hserver_iter, &param);
}

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return (next_timeout->tv_sec * 1000) + (next_timeout->tv_usec / 1000);
}